

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int dialer_get(nng_dialer id,char *n,void *v,size_t *szp,nni_type t)

{
  int iVar1;
  nni_dialer *local_30;
  nni_dialer *d;
  
  iVar1 = nni_dialer_find(&local_30,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_dialer_getopt(local_30,n,v,(size_t *)0x0,(nni_type)szp);
    nni_dialer_rele(local_30);
  }
  return iVar1;
}

Assistant:

static int
dialer_get(nng_dialer id, const char *n, void *v, size_t *szp, nni_type t)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_getopt(d, n, v, szp, t);
	nni_dialer_rele(d);
	return (rv);
}